

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O0

void __thiscall
CorUnix::CSynchCache<CorUnix::CSynchData>::Flush
          (CSynchCache<CorUnix::CSynchData> *this,CPalThread *pthrCurrent,bool fDontLock)

{
  _USynchCacheStackNode *p_Var1;
  USynchCacheStackNode *pTemp;
  USynchCacheStackNode *pNode;
  bool fDontLock_local;
  CPalThread *pthrCurrent_local;
  CSynchCache<CorUnix::CSynchData> *this_local;
  
  if (!fDontLock) {
    Lock(this,pthrCurrent);
  }
  pTemp = ::Volatile::operator_cast_to__USynchCacheStackNode_((Volatile *)this);
  Volatile<CorUnix::CSynchCache<CorUnix::CSynchData>::_USynchCacheStackNode_*>::operator=
            (&this->m_pHead,(_USynchCacheStackNode *)0x0);
  Volatile<int>::operator=(&this->m_iDepth,0);
  if (!fDontLock) {
    Unlock(this,pthrCurrent);
  }
  while (pTemp != (USynchCacheStackNode *)0x0) {
    p_Var1 = pTemp->next;
    InternalDelete<char>((char *)pTemp->objraw);
    pTemp = p_Var1;
  }
  return;
}

Assistant:

void Flush(CPalThread * pthrCurrent, bool fDontLock = false)
        {
            USynchCacheStackNode * pNode, * pTemp;

            if (!fDontLock)
            {
                Lock(pthrCurrent);
            }
            pNode = m_pHead;
            m_pHead = NULL;
            m_iDepth = 0;
            if (!fDontLock)
            {
                Unlock(pthrCurrent);
            }

            while (pNode)
            {
                pTemp = pNode;
                pNode = pNode->next;
                InternalDelete((char *)pTemp);
            }
        }